

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O1

bool __thiscall relive::LogManager::isActive(LogManager *this,string *className,int level)

{
  _Rb_tree_color _Var1;
  int iVar2;
  iterator iVar3;
  _Base_ptr p_Var4;
  string local_38;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar2 == 0) {
    detemplatedClassName(&local_38,className);
    iVar3 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            ::find(&(this->_logLevels)._M_t,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
    p_Var4 = (_Base_ptr)&this->_defaultLevel;
    if ((_Rb_tree_header *)iVar3._M_node != &(this->_logLevels)._M_t._M_impl.super__Rb_tree_header)
    {
      p_Var4 = iVar3._M_node + 2;
    }
    _Var1 = p_Var4->_M_color;
    pthread_mutex_unlock((pthread_mutex_t *)this);
    return level <= (int)_Var1;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

bool LogManager::isActive(const std::string& className, int level)
{
    std::lock_guard<std::mutex> lock(_mutex);
    LogLevels::const_iterator i = _logLevels.find(detemplatedClassName(className));
    if(i != _logLevels.end())
    {
        return i->second >= level;
    }
    else
    {
        return _defaultLevel >= level;
    }    
}